

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

void __thiscall
ON_RTree::SplitNode(ON_RTree *this,ON_RTreeNode *a_node,ON_RTreeBranch *a_branch,
                   ON_RTreeNode **a_newNode)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  double *pdVar6;
  ON_RTreeNode *a_nodeB;
  ON_RTreeBBox *pOVar7;
  ON_RTreeBBox *a_rectB;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double area [7];
  ON_RTreePartitionVars localVars;
  long local_390;
  ON_RTreeBBox local_328;
  ON_RTreeBBox local_2f8;
  ON_RTreePartitionVars local_2b8;
  
  iVar3 = a_node->m_level;
  memcpy(local_2b8.m_branchBuf,a_node->m_branch,0x150);
  local_2b8.m_branchBuf[6].m_rect.m_min[0] = (a_branch->m_rect).m_min[0];
  local_2b8.m_branchBuf[6].m_rect.m_min[1] = (a_branch->m_rect).m_min[1];
  local_2b8.m_branchBuf[6].m_rect.m_min[2] = (a_branch->m_rect).m_min[2];
  local_2b8.m_branchBuf[6].m_rect.m_max[0] = (a_branch->m_rect).m_max[0];
  local_2b8.m_branchBuf[6].m_rect.m_max[1] = (a_branch->m_rect).m_max[1];
  local_2b8.m_branchBuf[6].m_rect.m_max[2] = (a_branch->m_rect).m_max[2];
  local_2b8.m_branchBuf[6].field_1 = a_branch->field_1;
  local_2b8.m_branchCount = 7;
  local_2b8.m_coverSplit.m_min[0] = a_node->m_branch[0].m_rect.m_min[0];
  local_2b8.m_coverSplit.m_min[1] = a_node->m_branch[0].m_rect.m_min[1];
  local_2b8.m_coverSplit.m_min[2] = a_node->m_branch[0].m_rect.m_min[2];
  local_2b8.m_coverSplit.m_max[0] = a_node->m_branch[0].m_rect.m_max[0];
  local_2b8.m_coverSplit.m_max[1] = a_node->m_branch[0].m_rect.m_max[1];
  local_2b8.m_coverSplit.m_max[2] = a_node->m_branch[0].m_rect.m_max[2];
  lVar14 = 0xf0;
  do {
    CombineRectHelper(&local_2f8,&local_2b8.m_coverSplit,
                      (ON_RTreeBBox *)((long)local_2b8.m_partition + lVar14));
    local_2b8.m_coverSplit.m_max[1] = local_2f8.m_max[1];
    local_2b8.m_coverSplit.m_max[2] = local_2f8.m_max[2];
    local_2b8.m_coverSplit.m_min[2] = local_2f8.m_min[2];
    local_2b8.m_coverSplit.m_max[0] = local_2f8.m_max[0];
    local_2b8.m_coverSplit.m_min[0] = local_2f8.m_min[0];
    local_2b8.m_coverSplit.m_min[1] = local_2f8.m_min[1];
    lVar14 = lVar14 + 0x38;
  } while (lVar14 != 0x240);
  pdVar6 = local_2b8.m_branchBuf[0].m_rect.m_max + 2;
  local_2b8.m_coverSplitArea =
       (local_2f8.m_max[2] - local_2f8.m_min[2]) * (local_2f8.m_max[2] - local_2f8.m_min[2]) +
       (local_2f8.m_max[1] - local_2f8.m_min[1]) * (local_2f8.m_max[1] - local_2f8.m_min[1]) +
       (local_2f8.m_max[0] - local_2f8.m_min[0]) * (local_2f8.m_max[0] - local_2f8.m_min[0]);
  a_node->m_level = -1;
  a_node->m_count = 0;
  local_2b8.m_count[1] = 0;
  local_2b8.m_area[0] = 0.0;
  local_2b8.m_area[1] = 0.0;
  local_2b8.m_total = 7;
  local_2b8.m_minFill = 2;
  local_2b8.m_partition[0] = -1;
  local_2b8.m_partition[1] = -1;
  local_2b8.m_partition[2] = -1;
  local_2b8.m_partition[3] = -1;
  local_2b8.m_partition[4] = -1;
  local_2b8.m_partition[5] = -1;
  local_2b8.m_partition[6] = -1;
  local_2b8.m_taken[0] = 0;
  local_2b8.m_taken[1] = 0;
  local_2b8.m_taken[2] = 0;
  local_2b8.m_taken[3] = 0;
  local_2b8.m_taken[4] = 0;
  local_2b8.m_taken[5] = 0;
  local_2b8.m_taken[6] = 0;
  local_2b8.m_count[0] = 0;
  lVar14 = 0;
  do {
    dVar27 = pdVar6[-2] - ((ON_RTreeBBox *)(pdVar6 + -5))->m_min[0];
    local_2f8.m_min[lVar14] =
         (*pdVar6 - pdVar6[-3]) * (*pdVar6 - pdVar6[-3]) +
         (pdVar6[-1] - pdVar6[-4]) * (pdVar6[-1] - pdVar6[-4]) + dVar27 * dVar27;
    lVar14 = lVar14 + 1;
    pdVar6 = pdVar6 + 7;
  } while (lVar14 != 7);
  dVar27 = -1.0 - local_2b8.m_coverSplitArea;
  uVar8 = 1;
  local_390 = 0;
  uVar12 = 1;
  pOVar7 = &local_2b8.m_branchBuf[1].m_rect;
  iVar9 = 0;
  do {
    dVar26 = local_2f8.m_min[local_390];
    a_rectB = pOVar7;
    uVar13 = uVar12;
    do {
      CombineRectHelper(&local_328,&local_2b8.m_branchBuf[local_390].m_rect,a_rectB);
      dVar29 = (((local_328.m_max[2] - local_328.m_min[2]) *
                 (local_328.m_max[2] - local_328.m_min[2]) +
                (local_328.m_max[1] - local_328.m_min[1]) *
                (local_328.m_max[1] - local_328.m_min[1]) +
                (local_328.m_max[0] - local_328.m_min[0]) *
                (local_328.m_max[0] - local_328.m_min[0])) - dVar26) - local_2f8.m_min[uVar13];
      if (dVar27 < dVar29) {
        uVar8 = uVar13 & 0xffffffff;
      }
      iVar11 = (int)local_390;
      if (dVar29 <= dVar27) {
        dVar29 = dVar27;
        iVar11 = iVar9;
      }
      iVar9 = iVar11;
      dVar27 = dVar29;
      uVar13 = uVar13 + 1;
      a_rectB = (ON_RTreeBBox *)(a_rectB[1].m_min + 1);
    } while (uVar13 != 7);
    local_390 = local_390 + 1;
    uVar12 = uVar12 + 1;
    pOVar7 = (ON_RTreeBBox *)(pOVar7[1].m_min + 1);
  } while (local_390 != 6);
  ClassifyHelper(iVar9,0,&local_2b8);
  ClassifyHelper((int)uVar8,1,&local_2b8);
  if (local_2b8.m_count[1] + local_2b8.m_count[0] < local_2b8.m_total) {
    do {
      iVar9 = local_2b8.m_total - local_2b8.m_minFill;
      if ((iVar9 <= local_2b8.m_count[0]) || (iVar9 <= local_2b8.m_count[1])) {
        bVar4 = iVar9 <= local_2b8.m_count[0];
        if (0 < local_2b8.m_total) {
          lVar14 = 0;
          uVar5 = local_2b8.m_total;
          do {
            if (local_2b8.m_taken[lVar14] == 0) {
              ClassifyHelper((int)lVar14,(uint)bVar4,&local_2b8);
              uVar5 = local_2b8.m_total;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < (int)uVar5);
        }
        break;
      }
      if (local_2b8.m_total < 1) {
        iVar9 = 0;
        iVar11 = 0;
      }
      else {
        uVar12 = 0;
        uVar15 = 0;
        uVar16 = 0xbff00000;
        uVar13 = 0;
        pdVar6 = local_2b8.m_branchBuf[0].m_rect.m_max + 2;
        uVar8 = 0;
        do {
          if (local_2b8.m_taken[uVar12] == 0) {
            dVar27 = ((ON_RTreeBBox *)(pdVar6 + -5))->m_min[0];
            dVar26 = pdVar6[-4];
            dVar29 = pdVar6[-3];
            dVar28 = pdVar6[-2];
            dVar1 = pdVar6[-1];
            dVar2 = *pdVar6;
            dVar19 = local_2b8.m_cover[0].m_min[0];
            if (dVar27 <= local_2b8.m_cover[0].m_min[0]) {
              dVar19 = dVar27;
            }
            dVar21 = local_2b8.m_cover[0].m_min[1];
            if (dVar26 <= local_2b8.m_cover[0].m_min[1]) {
              dVar21 = dVar26;
            }
            dVar23 = local_2b8.m_cover[0].m_min[2];
            if (dVar29 <= local_2b8.m_cover[0].m_min[2]) {
              dVar23 = dVar29;
            }
            dVar25 = local_2b8.m_cover[0].m_max[0];
            if (local_2b8.m_cover[0].m_max[0] <= dVar28) {
              dVar25 = dVar28;
            }
            dVar20 = local_2b8.m_cover[0].m_max[1];
            if (local_2b8.m_cover[0].m_max[1] <= dVar1) {
              dVar20 = dVar1;
            }
            dVar22 = local_2b8.m_cover[0].m_max[2];
            if (local_2b8.m_cover[0].m_max[2] <= dVar2) {
              dVar22 = dVar2;
            }
            dVar24 = local_2b8.m_cover[1].m_min[0];
            if (dVar27 <= local_2b8.m_cover[1].m_min[0]) {
              dVar24 = dVar27;
            }
            dVar27 = local_2b8.m_cover[1].m_min[1];
            if (dVar26 <= local_2b8.m_cover[1].m_min[1]) {
              dVar27 = dVar26;
            }
            uVar17 = SUB84(local_2b8.m_cover[1].m_min[2],0);
            uVar18 = (undefined4)((ulong)local_2b8.m_cover[1].m_min[2] >> 0x20);
            if (dVar29 <= local_2b8.m_cover[1].m_min[2]) {
              uVar17 = SUB84(dVar29,0);
              uVar18 = (undefined4)((ulong)dVar29 >> 0x20);
            }
            dVar26 = local_2b8.m_cover[1].m_max[0];
            if (local_2b8.m_cover[1].m_max[0] <= dVar28) {
              dVar26 = dVar28;
            }
            dVar29 = local_2b8.m_cover[1].m_max[1];
            if (local_2b8.m_cover[1].m_max[1] <= dVar1) {
              dVar29 = dVar1;
            }
            dVar28 = local_2b8.m_cover[1].m_max[2];
            if (local_2b8.m_cover[1].m_max[2] <= dVar2) {
              dVar28 = dVar2;
            }
            dVar28 = dVar28 - (double)CONCAT44(uVar18,uVar17);
            dVar29 = ((dVar28 * dVar28 +
                      (dVar29 - dVar27) * (dVar29 - dVar27) + (dVar26 - dVar24) * (dVar26 - dVar24))
                     - local_2b8.m_area[1]) +
                     (local_2b8.m_area[0] -
                     ((dVar22 - dVar23) * (dVar22 - dVar23) +
                     (dVar20 - dVar21) * (dVar20 - dVar21) + (dVar25 - dVar19) * (dVar25 - dVar19)))
            ;
            dVar26 = -dVar29;
            dVar27 = dVar26;
            if (dVar29 >= dVar26) {
              dVar27 = dVar29;
            }
            uVar10 = (ulong)(dVar29 < dVar26);
            bVar4 = dVar27 == (double)CONCAT44(uVar16,uVar15);
            if (dVar27 < (double)CONCAT44(uVar16,uVar15) || bVar4) {
              if (((bVar4) && (!NAN(dVar27) && !NAN((double)CONCAT44(uVar16,uVar15)))) &&
                 (local_2b8.m_count[dVar29 < 0.0] < local_2b8.m_count[uVar8])) {
                uVar13 = uVar12 & 0xffffffff;
                uVar8 = uVar10;
              }
              goto LAB_005a8aa6;
            }
            uVar13 = uVar12 & 0xffffffff;
          }
          else {
LAB_005a8aa6:
            dVar27 = (double)CONCAT44(uVar16,uVar15);
            uVar10 = uVar8;
          }
          iVar11 = (int)uVar13;
          uVar12 = uVar12 + 1;
          pdVar6 = pdVar6 + 7;
          uVar15 = SUB84(dVar27,0);
          uVar16 = (undefined4)((ulong)dVar27 >> 0x20);
          iVar9 = (int)uVar10;
          uVar8 = uVar10;
        } while ((uint)local_2b8.m_total != uVar12);
      }
      ClassifyHelper(iVar11,iVar9,&local_2b8);
    } while (local_2b8.m_count[1] + local_2b8.m_count[0] < local_2b8.m_total);
  }
  a_nodeB = ON_RTreeMemPool::AllocNode(&this->m_mem_pool);
  *a_newNode = a_nodeB;
  a_node->m_level = iVar3;
  a_nodeB->m_level = iVar3;
  LoadNodes(this,a_node,a_nodeB,&local_2b8);
  return;
}

Assistant:

void ON_RTree::SplitNode(ON_RTreeNode* a_node, ON_RTreeBranch* a_branch, ON_RTreeNode** a_newNode)
{
  ON_RTreePartitionVars localVars;
  int level;

  // Load all the branches into a buffer, initialize a_node to be empty
  level = a_node->m_level; // save m_level (The InitNode() call in GetBranches will set it to -1)
  GetBranches(a_node, a_branch, &localVars);

  // Find partition
  ChoosePartition(&localVars, ON_RTree_MIN_NODE_COUNT);

  // Put branches from buffer into 2 nodes according to chosen partition
  *a_newNode = m_mem_pool.AllocNode();
  (*a_newNode)->m_level = a_node->m_level = level; // restore m_level
  LoadNodes(a_node, *a_newNode, &localVars);
}